

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::CommonEdgeCase::iterate(CommonEdgeCase *this)

{
  pointer *this_00;
  void **__return_storage_ptr__;
  deUint16 dVar1;
  deUint16 dVar2;
  short sVar3;
  undefined8 context;
  int iVar4;
  deUint32 dVar5;
  GLenum err;
  int iVar6;
  int iVar7;
  int iVar8;
  TestLog *pTVar9;
  undefined4 extraout_var;
  char *str;
  ShaderProgram *this_01;
  Functions *gl_00;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  __last;
  reference pvVar10;
  size_type sVar11;
  reference indices;
  TestLog *this_02;
  MessageBuilder *pMVar12;
  char *local_d30;
  VertexArrayBinding *local_cf0;
  GLint local_c94;
  int local_c7c;
  int local_c6c;
  MessageBuilder local_c58;
  int local_ad4;
  Vector<int,_2> local_ad0;
  MessageBuilder local_ac8;
  MessageBuilder local_948;
  RGBA local_7c4;
  int local_7c0;
  RGBA pixel;
  int x;
  int y;
  int endY;
  int startY;
  int endX;
  int startX;
  MessageBuilder local_628;
  char *local_4a8;
  allocator<char> local_499;
  string local_498;
  allocator<char> local_471;
  string local_470;
  LogImage local_450;
  MessageBuilder local_3c0;
  undefined1 local_240 [8];
  Surface rendered;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  void **local_1c0;
  undefined1 local_1b8 [8];
  VertexArrayBinding attrBindings [2];
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_108;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_100;
  value_type_conflict3 local_f6;
  int local_f4;
  int local_f0;
  int n;
  int m;
  int j_2;
  int i_2;
  int k_1;
  int k;
  int secondTriangleVertexIndexOffset;
  deUint16 corners [4];
  int j_1;
  int i_1;
  float local_c0;
  int local_bc;
  int local_b8;
  int j;
  int i;
  undefined1 local_a8 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> gridIndices;
  vector<float,_std::allocator<float>_> gridTessParams;
  vector<float,_std::allocator<float>_> gridPosComps;
  int totalNumPosComps;
  int numPosCompsPerVertex;
  int numIndices;
  int numVertices;
  int gridHeight;
  int gridWidth;
  Functions *gl;
  undefined1 local_38 [4];
  deUint32 programGL;
  RandomViewport viewport;
  RenderContext *renderCtx;
  TestLog *log;
  CommonEdgeCase *this_local;
  
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  viewport._8_8_ = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*((RenderContext *)viewport._8_8_)->_vptr_RenderContext[4])();
  str = tcu::TestNode::getName((TestNode *)this);
  dVar5 = deStringHash(str);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)local_38,(RenderTarget *)CONCAT44(extraout_var,iVar4),0x100,0x100,
             dVar5);
  this_01 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  dVar5 = glu::ShaderProgram::getProgram(this_01);
  gl_00 = (Functions *)(**(code **)(*(long *)viewport._8_8_ + 0x18))();
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    local_c6c = 6;
  }
  else {
    local_c6c = -1;
    if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
      local_c6c = 4;
    }
  }
  this_00 = &gridTessParams.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)this_00);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &gridIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_a8);
  std::vector<float,_std::allocator<float>_>::reserve
            ((vector<float,_std::allocator<float>_> *)this_00,0x32);
  std::vector<float,_std::allocator<float>_>::reserve
            ((vector<float,_std::allocator<float>_> *)
             &gridIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0x19);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_a8,
             (long)(local_c6c << 4));
  for (local_b8 = 0; local_b8 < 5; local_b8 = local_b8 + 1) {
    for (local_bc = 0; local_bc < 5; local_bc = local_bc + 1) {
      local_c0 = ((float)local_bc + 0.5 + (float)local_bc + 0.5) / 5.0 + -1.0;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)
                 &gridTessParams.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_c0);
      i_1 = (int)(((float)local_b8 + 0.5 + (float)local_b8 + 0.5) / 5.0 + -1.0);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)
                 &gridTessParams.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(value_type_conflict2 *)&i_1);
      j_1 = (int)((float)(local_b8 * 5 + local_bc) / 24.0);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)
                 &gridIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type_conflict2 *)&j_1);
    }
  }
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    corners[2] = 0;
    corners[3] = 0;
    for (; (int)corners._4_4_ < 4; corners._4_4_ = corners._4_4_ + 1) {
      corners[0] = 0;
      corners[1] = 0;
      for (; (int)corners._0_4_ < 4; corners._0_4_ = corners._0_4_ + 1) {
        dVar2 = (deUint16)corners._4_4_;
        dVar1 = (deUint16)corners._0_4_;
        k._0_2_ = dVar2 * 5 + dVar1;
        k._2_2_ = dVar2 * 5 + dVar1 + 1;
        secondTriangleVertexIndexOffset._0_2_ = (dVar2 + 1) * 5 + dVar1;
        secondTriangleVertexIndexOffset._2_2_ = (dVar2 + 1) * 5 + dVar1 + 1;
        if (this->m_caseType == CASETYPE_BASIC) {
          local_c7c = 0;
        }
        else {
          local_c7c = -1;
          if (this->m_caseType == CASETYPE_PRECISE) {
            local_c7c = 1;
          }
        }
        k_1 = local_c7c;
        for (i_2 = 0; i_2 < 3; i_2 = i_2 + 1) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_a8,
                     (value_type_conflict3 *)
                     ((long)&k +
                     (long)(((((int)corners._0_4_ / 3) * 3 - corners._0_4_) + 2 +
                            i_2 + corners._4_4_) % 3) * 2));
        }
        for (j_2 = 0; j_2 < 3; j_2 = j_2 + 1) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_a8,
                     (value_type_conflict3 *)
                     ((long)&k +
                     (long)((k_1 + 4 +
                            j_2 + corners._4_4_ + (((int)corners._0_4_ / 3) * 3 - corners._0_4_)) %
                            3 + 1) * 2));
        }
      }
    }
  }
  else if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
    for (m = 0; m < 4; m = m + 1) {
      for (n = 0; n < 4; n = n + 1) {
        for (local_f0 = 0; local_f0 < 2; local_f0 = local_f0 + 1) {
          for (local_f4 = 0; local_f4 < 2; local_f4 = local_f4 + 1) {
            sVar3 = (short)(n + local_f4);
            local_f6 = ((short)m + (short)((m + local_f0) % 2)) * 5 + (short)n +
                       (sVar3 - (sVar3 - (short)(n + local_f4 >> 0x1f) & 0xfffeU));
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_a8,&local_f6
                      );
          }
        }
        if ((this->m_caseType == CASETYPE_PRECISE) && ((m + n) % 2 == 0)) {
          local_108._M_current =
               (unsigned_short *)
               std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_a8);
          sVar11 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_a8);
          local_100 = __gnu_cxx::
                      __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      ::operator+(&local_108,sVar11 - 4);
          attrBindings[1].pointer.data =
               (void *)std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                                 ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                  local_a8);
          sVar11 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_a8);
          __last = __gnu_cxx::
                   __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                   ::operator+((__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                *)&attrBindings[1].pointer.data,sVar11);
          std::
          reverse<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                    (local_100,__last);
        }
      }
    }
  }
  setViewport(gl_00,(RandomViewport *)local_38);
  (*gl_00->clearColor)(0.0,0.0,0.0,1.0);
  (*gl_00->useProgram)(dVar5);
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    local_c94 = 3;
  }
  else {
    local_c94 = -1;
    if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
      local_c94 = 4;
    }
  }
  (*gl_00->patchParameteri)(0x8e72,local_c94);
  (*gl_00->clear)(0x4000);
  local_1c0 = (void **)local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"in_v_position",&local_1e1);
  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)
                       &gridTessParams.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0);
  glu::va::Float((VertexArrayBinding *)local_1b8,&local_1e0,2,0x19,0,pvVar10);
  __return_storage_ptr__ = &attrBindings[0].pointer.data;
  local_1c0 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"in_v_tessParam",&local_209);
  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)
                       &gridIndices.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0);
  glu::va::Float((VertexArrayBinding *)__return_storage_ptr__,&local_208,1,0x19,0,pvVar10);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  context = viewport._8_8_;
  sVar11 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_a8);
  indices = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_a8,0);
  glu::pr::Patches((PrimitiveList *)&rendered.m_pixels.m_cap,(int)sVar11,indices);
  glu::draw((RenderContext *)context,dVar5,2,(VertexArrayBinding *)local_1b8,
            (PrimitiveList *)&rendered.m_pixels.m_cap,(DrawUtilCallback *)0x0);
  err = (*gl_00->getError)();
  glu::checkError(err,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0x71c);
  local_cf0 = (VertexArrayBinding *)&attrBindings[1].pointer.data;
  do {
    local_cf0 = local_cf0 + -1;
    glu::VertexArrayBinding::~VertexArrayBinding(local_cf0);
  } while (local_cf0 != (VertexArrayBinding *)local_1b8);
  getPixels((Surface *)local_240,(RenderContext *)viewport._8_8_,(RandomViewport *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"RenderedImage",&local_471);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"Rendered Image",&local_499);
  tcu::LogImage::LogImage
            (&local_450,&local_470,&local_498,(Surface *)local_240,QP_IMAGE_COMPRESSION_MODE_BEST);
  this_02 = tcu::TestLog::operator<<(pTVar9,&local_450);
  tcu::TestLog::operator<<(&local_3c0,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar12 = tcu::MessageBuilder::operator<<
                      (&local_3c0,
                       (char (*) [74])
                       "Note: coloring is done to clarify the positioning and orientation of the ");
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    local_d30 = "triangles";
  }
  else {
    local_d30 = (char *)0x0;
    if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
      local_d30 = "quads";
    }
  }
  local_4a8 = local_d30;
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_4a8);
  pMVar12 = tcu::MessageBuilder::operator<<
                      (pMVar12,(char (*) [77])
                               "; the color of a vertex corresponds to the index of that vertex in the patch"
                      );
  tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3c0);
  tcu::LogImage::~LogImage(&local_450);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator(&local_471);
  if (this->m_caseType == CASETYPE_BASIC) {
    tcu::TestLog::operator<<(&local_628,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<
                        (&local_628,
                         (char (*) [79])
                         "Note: each shared vertex has the same index among the primitives it belongs to"
                        );
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_628);
  }
  else if (this->m_caseType == CASETYPE_PRECISE) {
    tcu::TestLog::operator<<
              ((MessageBuilder *)&endX,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&endX,
                         (char (*) [73])
                         "Note: the \'precise\' qualifier is used to avoid cracks between primitives"
                        );
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&endX);
  }
  iVar4 = tcu::Surface::getWidth((Surface *)local_240);
  iVar6 = tcu::Surface::getWidth((Surface *)local_240);
  iVar7 = tcu::Surface::getHeight((Surface *)local_240);
  iVar8 = tcu::Surface::getHeight((Surface *)local_240);
  pixel.m_value = (int)((float)iVar7 * 0.15);
  do {
    iVar7 = (int)((float)iVar4 * 0.15);
    if ((int)((float)iVar8 * 0.85) <= (int)pixel.m_value) {
      tcu::TestLog::operator<<(&local_c58,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          (&local_c58,
                           (char (*) [59])
                           "Success: there seem to be no cracks in the rendered result");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_c58);
      local_ad4 = 0;
LAB_02073809:
      tcu::Surface::~Surface((Surface *)local_240);
      if (local_ad4 == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
        this_local._4_4_ = STOP;
        local_ad4 = 1;
      }
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_a8);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)
                 &gridIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)
                 &gridTessParams.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return this_local._4_4_;
    }
    while (local_7c0 = iVar7, local_7c0 < (int)((float)iVar6 * 0.85)) {
      local_7c4 = tcu::Surface::getPixel((Surface *)local_240,local_7c0,pixel.m_value);
      iVar7 = tcu::RGBA::getRed(&local_7c4);
      if (((iVar7 == 0) && (iVar7 = tcu::RGBA::getGreen(&local_7c4), iVar7 == 0)) &&
         (iVar7 = tcu::RGBA::getBlue(&local_7c4), iVar7 == 0)) {
        tcu::TestLog::operator<<(&local_ac8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar12 = tcu::MessageBuilder::operator<<
                            (&local_ac8,
                             (char (*) [56])
                             "Failure: there seem to be cracks in the rendered result");
        pTVar9 = tcu::MessageBuilder::operator<<
                           (pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::TestLog::operator<<(&local_948,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar12 = tcu::MessageBuilder::operator<<
                            (&local_948,
                             (char (*) [52])"Note: pixel with zero r, g and b channels found at ");
        tcu::Vector<int,_2>::Vector(&local_ad0,local_7c0,pixel.m_value);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_ad0);
        tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_948);
        tcu::MessageBuilder::~MessageBuilder(&local_ac8);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Image verification failed");
        this_local._4_4_ = STOP;
        local_ad4 = 1;
        goto LAB_02073809;
      }
      iVar7 = local_7c0 + 1;
    }
    pixel.m_value = pixel.m_value + 1;
  } while( true );
}

Assistant:

CommonEdgeCase::IterateResult CommonEdgeCase::iterate (void)
{
	TestLog&					log						= m_testCtx.getLog();
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	const RandomViewport		viewport				(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32				programGL				= m_program->getProgram();
	const glw::Functions&		gl						= renderCtx.getFunctions();

	const int					gridWidth				= 4;
	const int					gridHeight				= 4;
	const int					numVertices				= (gridWidth+1)*(gridHeight+1);
	const int					numIndices				= gridWidth*gridHeight * (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3*2 : m_primitiveType == TESSPRIMITIVETYPE_QUADS ? 4 : -1);
	const int					numPosCompsPerVertex	= 2;
	const int					totalNumPosComps		= numPosCompsPerVertex*numVertices;
	vector<float>				gridPosComps;
	vector<float>				gridTessParams;
	vector<deUint16>			gridIndices;

	gridPosComps.reserve(totalNumPosComps);
	gridTessParams.reserve(numVertices);
	gridIndices.reserve(numIndices);

	{
		for (int i = 0; i < gridHeight+1; i++)
		for (int j = 0; j < gridWidth+1; j++)
		{
			gridPosComps.push_back(-1.0f + 2.0f * ((float)j + 0.5f) / (float)(gridWidth+1));
			gridPosComps.push_back(-1.0f + 2.0f * ((float)i + 0.5f) / (float)(gridHeight+1));
			gridTessParams.push_back((float)(i*(gridWidth+1) + j) / (float)(numVertices-1));
		}
	}

	// Generate patch vertex indices.
	// \note If CASETYPE_BASIC, the vertices are ordered such that when multiple
	//		 triangles/quads share a vertex, it's at the same index for everyone.

	if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
	{
		for (int i = 0; i < gridHeight; i++)
		for (int j = 0; j < gridWidth; j++)
		{
			const deUint16 corners[4] =
			{
				(deUint16)((i+0)*(gridWidth+1) + j+0),
				(deUint16)((i+0)*(gridWidth+1) + j+1),
				(deUint16)((i+1)*(gridWidth+1) + j+0),
				(deUint16)((i+1)*(gridWidth+1) + j+1)
			};

			const int secondTriangleVertexIndexOffset = m_caseType == CASETYPE_BASIC	? 0
													  : m_caseType == CASETYPE_PRECISE	? 1
													  : -1;
			DE_ASSERT(secondTriangleVertexIndexOffset != -1);

			for (int k = 0; k < 3; k++)
				gridIndices.push_back(corners[(k+0 + i + (2-j%3)) % 3]);
			for (int k = 0; k < 3; k++)
				gridIndices.push_back(corners[(k+2 + i + (2-j%3) + secondTriangleVertexIndexOffset) % 3 + 1]);
		}
	}
	else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
	{
		for (int i = 0; i < gridHeight; i++)
		for (int j = 0; j < gridWidth; j++)
		{
			// \note The vertices are ordered such that when multiple quads
			//		 share a vertices, it's at the same index for everyone.
			for (int m = 0; m < 2; m++)
			for (int n = 0; n < 2; n++)
				gridIndices.push_back((deUint16)((i+(i+m)%2)*(gridWidth+1) + j+(j+n)%2));

			if(m_caseType == CASETYPE_PRECISE && (i+j) % 2 == 0)
				std::reverse(gridIndices.begin() + (gridIndices.size() - 4),
							 gridIndices.begin() + gridIndices.size());
		}
	}
	else
		DE_ASSERT(false);

	DE_ASSERT((int)gridPosComps.size() == totalNumPosComps);
	DE_ASSERT((int)gridTessParams.size() == numVertices);
	DE_ASSERT((int)gridIndices.size() == numIndices);

	setViewport(gl, viewport);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.useProgram(programGL);

	{
		gl.patchParameteri(GL_PATCH_VERTICES, m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : m_primitiveType == TESSPRIMITIVETYPE_QUADS ? 4 : -1);
		gl.clear(GL_COLOR_BUFFER_BIT);

		const glu::VertexArrayBinding attrBindings[] =
		{
			glu::va::Float("in_v_position", numPosCompsPerVertex, numVertices, 0, &gridPosComps[0]),
			glu::va::Float("in_v_tessParam", 1, numVertices, 0, &gridTessParams[0])
		};

		glu::draw(renderCtx, programGL, DE_LENGTH_OF_ARRAY(attrBindings), &attrBindings[0],
			glu::pr::Patches((int)gridIndices.size(), &gridIndices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
	}

	{
		const tcu::Surface rendered = getPixels(renderCtx, viewport);

		log << TestLog::Image("RenderedImage", "Rendered Image", rendered)
			<< TestLog::Message << "Note: coloring is done to clarify the positioning and orientation of the "
								<< (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? "triangles" : m_primitiveType == TESSPRIMITIVETYPE_QUADS ? "quads" : DE_NULL)
								<< "; the color of a vertex corresponds to the index of that vertex in the patch"
								<< TestLog::EndMessage;

		if (m_caseType == CASETYPE_BASIC)
			log << TestLog::Message << "Note: each shared vertex has the same index among the primitives it belongs to" << TestLog::EndMessage;
		else if (m_caseType == CASETYPE_PRECISE)
			log << TestLog::Message << "Note: the 'precise' qualifier is used to avoid cracks between primitives" << TestLog::EndMessage;
		else
			DE_ASSERT(false);

		// Ad-hoc result verification - check that a certain rectangle in the image contains no black pixels.

		const int startX	= (int)(0.15f * (float)rendered.getWidth());
		const int endX		= (int)(0.85f * (float)rendered.getWidth());
		const int startY	= (int)(0.15f * (float)rendered.getHeight());
		const int endY		= (int)(0.85f * (float)rendered.getHeight());

		for (int y = startY; y < endY; y++)
		for (int x = startX; x < endX; x++)
		{
			const tcu::RGBA pixel = rendered.getPixel(x, y);

			if (pixel.getRed() == 0 && pixel.getGreen() == 0 && pixel.getBlue() == 0)
			{
				log << TestLog::Message << "Failure: there seem to be cracks in the rendered result" << TestLog::EndMessage
					<< TestLog::Message << "Note: pixel with zero r, g and b channels found at " << tcu::IVec2(x, y) << TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
				return STOP;
			}
		}

		log << TestLog::Message << "Success: there seem to be no cracks in the rendered result" << TestLog::EndMessage;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}